

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
* __thiscall
wallet::CWallet::GetNewDestination
          (Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
           *__return_storage_ptr__,CWallet *this,OutputType type,string label)

{
  ScriptPubKeyMan *pSVar1;
  T *address;
  bilingual_str *fmt;
  string *in_RCX;
  char *args;
  long in_FS_OFFSET;
  OutputType local_bc;
  unique_lock<std::recursive_mutex> local_b8;
  _Storage<wallet::AddressPurpose,_true> local_a8;
  undefined1 local_a4;
  bilingual_str local_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  args = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp";
  local_bc = type;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_b8,&this->cs_wallet,
             "cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
             ,0x9fd,false);
  pSVar1 = GetScriptPubKeyMan(this,&local_bc,false);
  if (pSVar1 == (ScriptPubKeyMan *)0x0) {
    _((bilingual_str *)&local_a8,(ConstevalStringLiteral)0x6f9614);
    fmt = (bilingual_str *)FormatOutputType_abi_cxx11_(local_bc);
    tinyformat::format<std::__cxx11::string>
              (&local_68,(tinyformat *)&local_a8,fmt,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    std::__detail::__variant::
    _Variant_storage<false,bilingual_str,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>
    ::_Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>
                *)__return_storage_ptr__,&local_68);
    bilingual_str::~bilingual_str(&local_68);
    bilingual_str::~bilingual_str((bilingual_str *)&local_a8);
  }
  else {
    (*pSVar1->_vptr_ScriptPubKeyMan[2])(__return_storage_ptr__,pSVar1,(ulong)local_bc);
    if ((__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
        .
        super__Move_assign_alias<bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
        .
        super__Copy_assign_alias<bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
        .
        super__Move_ctor_alias<bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
        .
        super__Copy_ctor_alias<bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
        .
        super__Variant_storage_alias<bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
        ._M_index == '\x01') {
      address = util::
                Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                ::value(__return_storage_ptr__);
      local_a8._M_value = RECEIVE;
      local_a4 = 1;
      SetAddressBook(this,address,in_RCX,(optional<wallet::AddressPurpose> *)&local_a8);
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<CTxDestination> CWallet::GetNewDestination(const OutputType type, const std::string label)
{
    LOCK(cs_wallet);
    auto spk_man = GetScriptPubKeyMan(type, /*internal=*/false);
    if (!spk_man) {
        return util::Error{strprintf(_("Error: No %s addresses available."), FormatOutputType(type))};
    }

    auto op_dest = spk_man->GetNewDestination(type);
    if (op_dest) {
        SetAddressBook(*op_dest, label, AddressPurpose::RECEIVE);
    }

    return op_dest;
}